

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstDumper.cc
# Opt level: O3

int __thiscall mcc::AstDumper::Visit(AstDumper *this,Grouping *grouping)

{
  element_type *peVar1;
  ostream *poVar2;
  int iVar3;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  iVar3 = this->spaces_ + 2;
  this->spaces_ = iVar3;
  poVar2 = this->out_;
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,(char)iVar3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<grouping>\n",0xb);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  peVar1 = (grouping->expr_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_Expr[1])(peVar1,this);
  poVar2 = this->out_;
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,(char)this->spaces_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</grouping>\n",0xc);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  this->spaces_ = this->spaces_ + -2;
  return 0;
}

Assistant:

int AstDumper::Visit(Grouping& grouping) {
  spaces_ += TAB_SIZE;
  out_ << std::string(spaces_, ' ') << "<grouping>\n";
  grouping.expr_->Accept(*this);
  out_ << std::string(spaces_, ' ') << "</grouping>\n";
  spaces_ -= TAB_SIZE;
  return 0;
}